

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bsplitcb(const_bstring str,uchar splitChar,int pos,_func_int_void_ptr_int_int *cb,void *parm)

{
  int iVar1;
  int local_38;
  int ret;
  int p;
  int i;
  void *parm_local;
  _func_int_void_ptr_int_int *cb_local;
  int pos_local;
  uchar splitChar_local;
  const_bstring str_local;
  
  if ((((cb == (_func_int_void_ptr_int_int *)0x0) || (str == (const_bstring)0x0)) || (pos < 0)) ||
     (local_38 = pos, str->slen < pos)) {
    str_local._4_4_ = -1;
  }
  else {
    do {
      for (ret = local_38; (ret < str->slen && (str->data[ret] != splitChar)); ret = ret + 1) {
      }
      iVar1 = (*cb)(parm,local_38,ret - local_38);
      if (iVar1 < 0) {
        return iVar1;
      }
      local_38 = ret + 1;
    } while (local_38 <= str->slen);
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int bsplitcb (const_bstring str, unsigned char splitChar, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen)
		return BSTR_ERR;

	p = pos;
	do {
		for (i=p; i < str->slen; i++) {
			if (str->data[i] == splitChar) break;
		}
		if ((ret = cb (parm, p, i - p)) < 0) return ret;
		p = i + 1;
	} while (p <= str->slen);
	return BSTR_OK;
}